

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::ClCommandLine::add<char_const*,char_const*>
          (ClCommandLine *this,string *s,char *strs,char *strs_1)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x10),s);
  std::__cxx11::string::string((string *)&local_40,strs,&local_41);
  add<char_const*>(this,&local_40,strs_1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void add (std::string const & s, Strs... strs) {
            strings_.push_back (s);
            this->add (strs...);
        }